

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_cbc_mode.c
# Opt level: O0

int tc_cbc_mode_decrypt(uint8_t *out,uint outlen,uint8_t *in,uint inlen,uint8_t *iv,
                       TCAesKeySched_t sched)

{
  uint local_68;
  uint local_64;
  uint m;
  uint n;
  uint8_t *p;
  uint8_t buffer [16];
  TCAesKeySched_t sched_local;
  uint8_t *iv_local;
  uint8_t *puStack_28;
  uint inlen_local;
  uint8_t *in_local;
  byte *pbStack_18;
  uint outlen_local;
  uint8_t *out_local;
  
  if (((((out == (uint8_t *)0x0) || (in == (uint8_t *)0x0)) || (sched == (TCAesKeySched_t)0x0)) ||
      ((inlen == 0 || (outlen == 0)))) ||
     (((inlen & 0xf) != 0 || (((outlen & 0xf) != 0 || (outlen != inlen)))))) {
    out_local._4_4_ = 0;
  }
  else {
    local_68 = 0;
    _m = iv;
    puStack_28 = in;
    pbStack_18 = out;
    for (local_64 = 0; local_64 < outlen; local_64 = local_64 + 1) {
      if ((local_64 & 0xf) == 0) {
        tc_aes_decrypt((uint8_t *)&p,puStack_28,sched);
        puStack_28 = puStack_28 + 0x10;
        local_68 = 0;
      }
      *pbStack_18 = buffer[(ulong)local_68 - 8] ^ *_m;
      local_68 = local_68 + 1;
      _m = _m + 1;
      pbStack_18 = pbStack_18 + 1;
    }
    out_local._4_4_ = 1;
  }
  return out_local._4_4_;
}

Assistant:

int tc_cbc_mode_decrypt(uint8_t *out, unsigned int outlen, const uint8_t *in,
			    unsigned int inlen, const uint8_t *iv,
			    const TCAesKeySched_t sched)
{

	uint8_t buffer[TC_AES_BLOCK_SIZE];
	const uint8_t *p;
	unsigned int n, m;

	/* sanity check the inputs */
	if (out == (uint8_t *) 0 ||
	    in == (const uint8_t *) 0 ||
	    sched == (TCAesKeySched_t) 0 ||
	    inlen == 0 ||
	    outlen == 0 ||
	    (inlen % TC_AES_BLOCK_SIZE) != 0 ||
	    (outlen % TC_AES_BLOCK_SIZE) != 0 ||
	    outlen != inlen) {
		return TC_CRYPTO_FAIL;
	}

	/*
	 * Note that in == iv + ciphertext, i.e. the iv and the ciphertext are
	 * contiguous. This allows for a very efficient decryption algorithm
	 * that would not otherwise be possible.
	 */
	p = iv;
	for (n = m = 0; n < outlen; ++n) {
		if ((n % TC_AES_BLOCK_SIZE) == 0) {
			(void)tc_aes_decrypt(buffer, in, sched);
			in += TC_AES_BLOCK_SIZE;
			m = 0;
		}
		*out++ = buffer[m++] ^ *p++;
	}

	return TC_CRYPTO_SUCCESS;
}